

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdiarea.cpp
# Opt level: O2

void __thiscall QMdiAreaPrivate::_q_currentTabChanged(QMdiAreaPrivate *this,int index)

{
  int iVar1;
  QPointer<QMdiSubWindow> *pQVar2;
  Data *pDVar3;
  int iVar4;
  long lVar5;
  QObject *pQVar6;
  
  if (index < 0 || this->tabBar == (QMdiAreaTabBar *)0x0) {
    return;
  }
  iVar1 = this->indexToLastActiveTab;
  if (-1 < iVar1) {
    iVar4 = QTabBar::count(&this->tabBar->super_QTabBar);
    if (iVar1 < iVar4) {
      lVar5 = (long)this->indexToLastActiveTab;
      if (lVar5 < (this->childWindows).d.size) {
        pQVar2 = (this->childWindows).d.ptr;
        pDVar3 = pQVar2[lVar5].wp.d;
        if ((((pDVar3 != (Data *)0x0) && (*(int *)(pDVar3 + 4) != 0)) &&
            (pQVar6 = pQVar2[lVar5].wp.value, pQVar6 != (QObject *)0x0)) &&
           ((*(byte *)(*(long *)(pQVar6 + 0x20) + 10) & 1) != 0)) {
          QTabBar::setTabEnabled(&this->tabBar->super_QTabBar,this->indexToLastActiveTab,false);
        }
      }
    }
  }
  this->indexToLastActiveTab = index;
  pQVar2 = (this->childWindows).d.ptr;
  pDVar3 = pQVar2[(uint)index].wp.d;
  if ((pDVar3 == (Data *)0x0) || (*(int *)(pDVar3 + 4) == 0)) {
    pQVar6 = (QObject *)0x0;
  }
  else {
    pQVar6 = pQVar2[(uint)index].wp.value;
  }
  activateWindow(this,(QMdiSubWindow *)pQVar6);
  return;
}

Assistant:

void QMdiAreaPrivate::_q_currentTabChanged(int index)
{
#if !QT_CONFIG(tabbar)
    Q_UNUSED(index);
#else
    if (!tabBar || index < 0)
        return;

    // If the previous active sub-window was hidden, disable the tab.
    if (indexToLastActiveTab >= 0 && indexToLastActiveTab < tabBar->count()
        && indexToLastActiveTab < childWindows.size()) {
        QMdiSubWindow *lastActive = childWindows.at(indexToLastActiveTab);
        if (lastActive && lastActive->isHidden())
            tabBar->setTabEnabled(indexToLastActiveTab, false);
    }

    indexToLastActiveTab = index;
    Q_ASSERT(childWindows.size() > index);
    QMdiSubWindow *subWindow = childWindows.at(index);
    Q_ASSERT(subWindow);
    activateWindow(subWindow);
#endif // QT_CONFIG(tabbar)
}